

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O0

void clean_msgs(borg_read_messages *msgs)

{
  int local_14;
  int i;
  borg_read_messages *msgs_local;
  
  for (local_14 = 0; local_14 < msgs->count; local_14 = local_14 + 1) {
    string_free(msgs->messages[local_14].message_p1);
    string_free(msgs->messages[local_14].message_p2);
    string_free(msgs->messages[local_14].message_p3);
  }
  mem_free(msgs->messages);
  msgs->messages = (borg_read_message *)0x0;
  mem_free(msgs->index);
  msgs->index = (int *)0x0;
  msgs->count = 0;
  msgs->allocated = 0;
  return;
}

Assistant:

static void clean_msgs(struct borg_read_messages *msgs)
{
    int i;

    for (i = 0; i < msgs->count; ++i) {
        string_free(msgs->messages[i].message_p1);
        string_free(msgs->messages[i].message_p2);
        string_free(msgs->messages[i].message_p3);
    }
    mem_free(msgs->messages);
    msgs->messages = NULL;
    mem_free(msgs->index);
    msgs->index     = NULL;
    msgs->count     = 0;
    msgs->allocated = 0;
}